

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void raviV_op_newtable(lua_State *L,CallInfo *ci,TValue *ra,int b,int c)

{
  int iVar1;
  int *piVar2;
  uint nasize;
  uint nhsize;
  Table *t;
  int iVar3;
  char *__assertion;
  
  t = luaH_new(L);
  if ((t->tt & 0xe) < 10) {
    (ra->value_).gc = (GCObject *)t;
    ra->tt_ = 0x8005;
    if ((t->tt == '\x05') &&
       ((L == (lua_State *)0x0 || ((t->marked & (L->l_G->currentwhite ^ 0x18)) == 0)))) {
      if (c != 0 || b != 0) {
        nasize = luaO_fb2int(b);
        nhsize = luaO_fb2int(c);
        luaH_resize(L,t,nasize,nhsize);
      }
      if (0 < L->l_G->GCdebt) {
        L->top = ra + 1;
        luaC_step(L);
        L->top = ci->top;
      }
      piVar2 = *(int **)&L[-1].hookmask;
      iVar1 = *piVar2;
      iVar3 = iVar1 + -1;
      *piVar2 = iVar3;
      if (iVar3 == 0) {
        *piVar2 = iVar1;
        return;
      }
      __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xaf4,"void raviV_op_newtable(lua_State *, CallInfo *, TValue *, int, int)");
    }
    __assertion = "0";
  }
  else {
    __assertion = "(((x_)->tt) & 0x0F) < (9+1)";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                ,0xaf2,"void raviV_op_newtable(lua_State *, CallInfo *, TValue *, int, int)");
}

Assistant:

void raviV_op_newtable(lua_State *L, CallInfo *ci, TValue *ra, int b, int c) {
  Table *t = luaH_new(L);
  sethvalue(L, ra, t);
  if (b != 0 || c != 0) luaH_resize(L, t, luaO_fb2int(b), luaO_fb2int(c));
  checkGC_(L, ra + 1);
}